

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void anon_unknown.dwarf_7fa20::testFloatToHalf(uint floatVal,uint halfVal)

{
  uint16_t uVar1;
  ostream *poVar2;
  void *this;
  uint in_ESI;
  float in_EDI;
  anon_union_4_2_7f9ecfed u;
  half local_10;
  uint16_t local_e;
  float local_c;
  uint local_8;
  
  local_c = in_EDI;
  local_8 = in_ESI;
  poVar2 = std::operator<<((ostream *)&std::cout,"floatToHalf (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
  poVar2 = std::operator<<(poVar2,") == ");
  local_e = Imf_3_4::floatToHalf(local_c);
  this = (void *)::operator<<(poVar2,(half)local_e);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_10._h = Imf_3_4::floatToHalf(local_c);
  uVar1 = Imath_3_2::half::bits(&local_10);
  if (uVar1 == local_8) {
    return;
  }
  __assert_fail("floatToHalf (u.f).bits () == halfVal",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x45,"void (anonymous namespace)::testFloatToHalf(unsigned int, unsigned int)");
}

Assistant:

void
testFloatToHalf (unsigned int floatVal, unsigned int halfVal)
{
    union
    {
        unsigned int ui;
        float        f;
    } u;
    u.ui = floatVal;
    cout << "floatToHalf (" << u.f << ") == " << floatToHalf (u.f) << endl;
    assert (floatToHalf (u.f).bits () == halfVal);
}